

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O0

void __thiscall GlobOpt::FillBailOutInfo(GlobOpt *this,BasicBlock *block,BailOutInfo *bailOutInfo)

{
  code *pcVar1;
  anon_class_24_3_2aa32aa7_for_fn fn;
  Opnd **this_00;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  BVSparse<Memory::JitArenaAllocator> *pBVar5;
  Type pJVar6;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar7;
  Type_conflict pBVar8;
  Type_conflict node;
  StackSym *pSVar9;
  SymOpnd *pSVar10;
  Value *pVVar11;
  JitArenaAllocator *pJVar12;
  StackLiteralInitFldDataMap *this_01;
  RegOpnd *pRVar13;
  uint argOutCount;
  StackSym *sym_1;
  TrackAllocData local_1a8;
  StackSym *local_180;
  StackSym *sym;
  Opnd **opnd;
  Iterator __iter;
  TrackAllocData local_150;
  uint local_124;
  code *pcStack_120;
  uint totalOutParamCount;
  BVSparse<Memory::JitArenaAllocator> *local_118;
  TrackAllocData local_110;
  code *local_e8;
  BVSparse<Memory::JitArenaAllocator> *local_e0;
  TrackAllocData local_d8;
  uint local_b0;
  uint local_ac;
  uint startCallNumber;
  uint currentArgOutCount;
  uint local_a0;
  undefined4 uStack_9c;
  Loop *local_98;
  undefined1 local_8c [8];
  uint i;
  undefined8 local_80;
  TrackAllocData local_78;
  IntOverflowDoesNotMatterRange *local_50;
  StackLiteralBailOutInfo *stackLiteralBailOutInfo;
  BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBStack_40;
  uint stackLiteralInitFldDataCount;
  StackLiteralInitFldDataMap *stackLiteralInitFldDataMap;
  BVSparse<Memory::JitArenaAllocator> *argsToCapture;
  BailOutInfo *bailOutInfo_local;
  BasicBlock *block_local;
  GlobOpt *this_local;
  bool local_9;
  
  argsToCapture = (BVSparse<Memory::JitArenaAllocator> *)bailOutInfo;
  bailOutInfo_local = (BailOutInfo *)block;
  block_local = (BasicBlock *)this;
  if ((*(uint *)&this->field_0xf4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x3c7,"(!this->isCallHelper)",
                       "Bail out can\'t be inserted the middle of CallHelper sequence");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  stackLiteralInitFldDataMap = (StackLiteralInitFldDataMap *)0x0;
  pBVar5 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                     ((BVSparse<Memory::JitArenaAllocator> *)bailOutInfo_local[1].startCallInfo,
                      this->func->m_alloc);
  argsToCapture[3].lastFoundIndex = (Type_conflict)pBVar5;
  pBVar5 = BVSparse<Memory::JitArenaAllocator>::CopyNew
                     ((BVSparse<Memory::JitArenaAllocator> *)
                      bailOutInfo_local[1].stackLiteralBailOutInfo,this->func->m_alloc);
  argsToCapture[3].lastUsedNodePrevNextField = &pBVar5->head;
  pJVar6 = (Type)BVSparse<Memory::JitArenaAllocator>::MinusNew
                           ((BVSparse<Memory::JitArenaAllocator> *)bailOutInfo_local[1].argOutSyms,
                            *(BVSparse<Memory::JitArenaAllocator> **)
                             &bailOutInfo_local[1].stackLiteralBailOutInfoCount,this->func->m_alloc)
  ;
  argsToCapture[3].alloc = pJVar6;
  pBStack_40 = *(BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 **)(bailOutInfo_local + 2);
  if ((pBStack_40 !=
       (BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        *)0x0) &&
     (stackLiteralBailOutInfo._4_4_ =
           JsUtil::
           BaseDictionary<StackSym_*,_StackLiteralInitFldData,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::Count(pBStack_40), stackLiteralBailOutInfo._4_4_ != 0)) {
    pJVar12 = this->func->m_alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_78,(type_info *)&BailOutInfo::StackLiteralBailOutInfo::typeinfo,0,
               (ulong)stackLiteralBailOutInfo._4_4_,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
               ,0x3dd);
    pAVar7 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar12,&local_78);
    stack0xffffffffffffff78 = Memory::ArenaAllocator::Alloc;
    local_80._0_4_ = 0;
    local_80._4_4_ = 0;
    _startCallNumber =
         (IntOverflowDoesNotMatterRange *)
         Memory::AllocateArray<Memory::ArenaAllocator,BailOutInfo::StackLiteralBailOutInfo,false>
                   ((Memory *)pAVar7,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                    (ulong)stackLiteralBailOutInfo._4_4_);
    local_8c._0_4_ = 0;
    local_a0 = stackLiteralBailOutInfo._4_4_;
    local_98 = (Loop *)local_8c;
    fn._12_4_ = uStack_9c;
    fn.stackLiteralInitFldDataCount = stackLiteralBailOutInfo._4_4_;
    fn.stackLiteralBailOutInfo = (StackLiteralBailOutInfo *)_startCallNumber;
    fn.i = (uint *)local_98;
    local_50 = _startCallNumber;
    JsUtil::
    BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::Map<GlobOpt::FillBailOutInfo(BasicBlock*,BailOutInfo*)::__0>
              ((BaseDictionary<StackSym*,StackLiteralInitFldData,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)pBStack_40,fn);
    if (local_8c._0_4_ != stackLiteralBailOutInfo._4_4_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,1000,"(i == stackLiteralInitFldDataCount)",
                         "i == stackLiteralInitFldDataCount");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    *(uint *)&argsToCapture[2].lastUsedNodePrevNextField = stackLiteralBailOutInfo._4_4_;
    argsToCapture[3].head = (Type_conflict)local_50;
  }
  bVar2 = TrackArgumentsObject(this);
  if (bVar2) {
    CaptureArguments(this,(BasicBlock *)bailOutInfo_local,(BailOutInfo *)argsToCapture,
                     this->func->m_alloc);
  }
  if ((bailOutInfo_local[1].branchConditionOpnd != (Opnd *)0x0) &&
     (bVar2 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Empty
                        ((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
                         bailOutInfo_local[1].branchConditionOpnd), !bVar2)) {
    local_ac = 0;
    local_b0 = *(uint *)&bailOutInfo_local[1].bailOutOpcode;
    pJVar12 = this->func->m_alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_d8,(type_info *)&unsigned_int::typeinfo,0,(ulong)local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
               ,0x3f8);
    pAVar7 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar12,&local_d8);
    local_e8 = Memory::JitArenaAllocator::Alloc;
    local_e0 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    pBVar8 = (Type_conflict)
             Memory::AllocateArray<Memory::JitArenaAllocator,unsigned_int,false>
                       ((Memory *)pAVar7,(JitArenaAllocator *)Memory::JitArenaAllocator::Alloc,0,
                        (ulong)local_b0);
    argsToCapture[2].lastFoundIndex = pBVar8;
    *(uint *)((long)&argsToCapture[1].alloc + 4) = local_b0;
    pJVar12 = this->func->m_alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_110,(type_info *)&Func*::typeinfo,0,(ulong)local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
               ,0x3fd);
    pAVar7 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar12,&local_110);
    pcStack_120 = Memory::JitArenaAllocator::Alloc;
    local_118 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
    pBVar8 = (Type_conflict)
             Memory::AllocateArray<Memory::JitArenaAllocator,Func*,false>
                       ((Memory *)pAVar7,(JitArenaAllocator *)Memory::JitArenaAllocator::Alloc,0,
                        (ulong)local_b0);
    argsToCapture[2].head = pBVar8;
    local_124 = *(uint *)&bailOutInfo_local[1].bailOutFunc;
    *(uint *)&argsToCapture[1].lastUsedNodePrevNextField = local_124;
    pJVar12 = this->func->m_alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_150,(type_info *)&StackSym*::typeinfo,0,(ulong)local_124,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
               ,0x403);
    pAVar7 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar12,&local_150);
    __iter.current = (NodeBase *)Memory::JitArenaAllocator::AllocZero;
    pJVar6 = (Type)Memory::AllocateArray<Memory::JitArenaAllocator,StackSym*,false>
                             ((Memory *)pAVar7,
                              (JitArenaAllocator *)Memory::JitArenaAllocator::AllocZero,0,
                              (ulong)local_124);
    argsToCapture[2].alloc = pJVar6;
    _opnd = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::GetIterator
                      ((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)
                       bailOutInfo_local[1].branchConditionOpnd);
    while( true ) {
      this_local = (GlobOpt *)&opnd;
      if (__iter.list == (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      this_00 = opnd;
      node = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar2 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node);
      if (!bVar2) {
        SListNodeBase<Memory::ArenaAllocator>::Next
                  (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      }
      local_9 = !bVar2;
      if (!local_9) break;
      sym = (StackSym *)
            SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                      ((Iterator *)&opnd);
      pSVar9 = IR::Opnd::GetStackSym((Opnd *)(sym->super_Sym)._vptr_Sym);
      bVar2 = StackSym::HasArgSlotNum(pSVar9);
      if (bVar2) {
        bVar2 = IR::Opnd::IsSymOpnd((Opnd *)(sym->super_Sym)._vptr_Sym);
        if (bVar2) {
          pSVar10 = IR::Opnd::AsSymOpnd((Opnd *)(sym->super_Sym)._vptr_Sym);
          local_180 = Sym::AsStackSym(pSVar10->m_sym);
          bVar2 = StackSym::IsArgSlotSym(local_180);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x40d,"(sym->IsArgSlotSym())","sym->IsArgSlotSym()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
          if ((*(uint *)&local_180->field_0x18 & 1) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x40e,"(sym->m_isSingleDef)","sym->m_isSingleDef");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
          if ((((((local_180->field_5).m_instrDef)->m_opcode != ArgOut_A) &&
               (((local_180->field_5).m_instrDef)->m_opcode != ArgOut_A_Inline)) &&
              (((local_180->field_5).m_instrDef)->m_opcode != ArgOut_A_InlineBuiltIn)) &&
             ((((local_180->field_5).m_instrDef)->m_opcode != ArgOut_A_SpreadArg &&
              (((local_180->field_5).m_instrDef)->m_opcode != ArgOut_A_Dynamic)))) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x413,
                               "(sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Inline || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_SpreadArg || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Dynamic)"
                               ,
                               "sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Inline || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_SpreadArg || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Dynamic"
                              );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
        }
        else {
          local_180 = IR::Opnd::GetStackSym((Opnd *)(sym->super_Sym)._vptr_Sym);
          pVVar11 = GlobOptBlockData::FindValue
                              (&this->currentBlock->globOptData,&local_180->super_Sym);
          if (pVVar11 == (Value *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x418,"(this->currentBlock->globOptData.FindValue(sym))",
                               "this->currentBlock->globOptData.FindValue(sym)");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
          if (stackLiteralInitFldDataMap == (StackLiteralInitFldDataMap *)0x0) {
            pJVar12 = this->tempAlloc;
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_1a8,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                       0xffffffffffffffff,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                       ,0x41c);
            pJVar12 = (JitArenaAllocator *)
                      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                      *)pJVar12,&local_1a8);
            this_01 = (StackLiteralInitFldDataMap *)
                      new<Memory::JitArenaAllocator>(0x20,pJVar12,0x4e98c0);
            BVSparse<Memory::JitArenaAllocator>::BVSparse
                      ((BVSparse<Memory::JitArenaAllocator> *)this_01,this->tempAlloc);
            stackLiteralInitFldDataMap = this_01;
          }
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((BVSparse<Memory::JitArenaAllocator> *)stackLiteralInitFldDataMap,
                     (local_180->super_Sym).m_id);
        }
        if (local_124 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x422,"(totalOutParamCount != 0)","totalOutParamCount != 0");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        if (local_124 <= local_ac) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x423,"(totalOutParamCount > currentArgOutCount)",
                             "totalOutParamCount > currentArgOutCount");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        local_ac = local_ac + 1;
        (&((argsToCapture[2].alloc)->super_ArenaAllocator).
          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_Allocator.
          outOfMemoryFunc)[local_124 - local_ac] = (_func_void *)local_180;
      }
      else {
        bVar2 = IR::Opnd::IsRegOpnd((Opnd *)(sym->super_Sym)._vptr_Sym);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x42d,"(opnd->IsRegOpnd())","opnd->IsRegOpnd()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        pRVar13 = IR::Opnd::AsRegOpnd((Opnd *)(sym->super_Sym)._vptr_Sym);
        pSVar9 = pRVar13->m_sym;
        bVar2 = StackSym::IsArgSlotSym(pSVar9);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x42f,"(!sym->IsArgSlotSym())","!sym->IsArgSlotSym()");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        if ((*(uint *)&pSVar9->field_0x18 & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x430,"(sym->m_isSingleDef)","sym->m_isSingleDef");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        if (((pSVar9->field_5).m_instrDef)->m_opcode != StartCall) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x431,"(sym->m_instrDef->m_opcode == Js::OpCode::StartCall)",
                             "sym->m_instrDef->m_opcode == Js::OpCode::StartCall");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        if (local_b0 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x433,"(startCallNumber != 0)","startCallNumber != 0");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        local_b0 = local_b0 - 1;
        (&(argsToCapture[2].head)->next)[local_b0] = (Type)((pSVar9->field_5).m_instrDef)->m_func;
        uVar3 = IR::Instr::GetArgOutCount((pSVar9->field_5).m_instrDef,true);
        if (local_124 < uVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x43e,"(totalOutParamCount >= argOutCount)",
                             "totalOutParamCount >= argOutCount");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        if (uVar3 < local_ac) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                             ,0x43f,"(argOutCount >= currentArgOutCount)",
                             "argOutCount >= currentArgOutCount");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        BailOutInfo::RecordStartCallInfo
                  ((BailOutInfo *)argsToCapture,local_b0,(pSVar9->field_5).m_instrDef);
        local_124 = local_124 - uVar3;
        local_ac = 0;
      }
    }
    if (local_124 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x448,"(totalOutParamCount == 0)","totalOutParamCount == 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    if (local_b0 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x449,"(startCallNumber == 0)","startCallNumber == 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    if (local_ac != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x44a,"(currentArgOutCount == 0)","currentArgOutCount == 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  CaptureValues(this,(BasicBlock *)bailOutInfo_local,(BailOutInfo *)argsToCapture,
                (BVSparse<Memory::JitArenaAllocator> *)stackLiteralInitFldDataMap);
  return;
}

Assistant:

void
GlobOpt::FillBailOutInfo(BasicBlock *block, BailOutInfo * bailOutInfo)
{
    AssertMsg(!this->isCallHelper, "Bail out can't be inserted the middle of CallHelper sequence");

    BVSparse<JitArenaAllocator>* argsToCapture = nullptr;

    bailOutInfo->liveVarSyms = block->globOptData.liveVarSyms->CopyNew(this->func->m_alloc);
    bailOutInfo->liveFloat64Syms = block->globOptData.liveFloat64Syms->CopyNew(this->func->m_alloc);
    // The live int32 syms in the bailout info are only the syms resulting from lossless conversion to int. If the int32 value
    // was created from a lossy conversion to int, the original var value cannot be re-materialized from the int32 value. So, the
    // int32 version is considered to be not live for the purposes of bailout, which forces the var or float versions to be used
    // directly for restoring the value during bailout. Otherwise, bailout may try to re-materialize the var value by converting
    // the lossily-converted int value back into a var, restoring the wrong value.
    bailOutInfo->liveLosslessInt32Syms =
        block->globOptData.liveInt32Syms->MinusNew(block->globOptData.liveLossyInt32Syms, this->func->m_alloc);

    // Save the stack literal init field count so we can null out the uninitialized fields
    StackLiteralInitFldDataMap * stackLiteralInitFldDataMap = block->globOptData.stackLiteralInitFldDataMap;
    if (stackLiteralInitFldDataMap != nullptr)
    {
        uint stackLiteralInitFldDataCount = stackLiteralInitFldDataMap->Count();
        if (stackLiteralInitFldDataCount != 0)
        {
            auto stackLiteralBailOutInfo = AnewArray(this->func->m_alloc,
                BailOutInfo::StackLiteralBailOutInfo, stackLiteralInitFldDataCount);
            uint i = 0;
            stackLiteralInitFldDataMap->Map(
                [stackLiteralBailOutInfo, stackLiteralInitFldDataCount, &i](StackSym * stackSym, StackLiteralInitFldData const& data)
            {
                Assert(i < stackLiteralInitFldDataCount);
                stackLiteralBailOutInfo[i].stackSym = stackSym;
                stackLiteralBailOutInfo[i].initFldCount = data.currentInitFldCount;
                i++;
            });

            Assert(i == stackLiteralInitFldDataCount);
            bailOutInfo->stackLiteralBailOutInfoCount = stackLiteralInitFldDataCount;
            bailOutInfo->stackLiteralBailOutInfo = stackLiteralBailOutInfo;
        }
    }

    if (TrackArgumentsObject())
    {
        this->CaptureArguments(block, bailOutInfo, this->func->m_alloc);
    }

    if (block->globOptData.callSequence && !block->globOptData.callSequence->Empty())
    {
        uint currentArgOutCount = 0;
        uint startCallNumber = block->globOptData.startCallCount;

        bailOutInfo->startCallInfo = JitAnewArray(this->func->m_alloc, BailOutInfo::StartCallInfo, startCallNumber);
        bailOutInfo->startCallCount = startCallNumber;

        // Save the start call's func to identify the function (inlined) that the call sequence is for
        // We might not have any arg out yet to get the function from
        bailOutInfo->startCallFunc = JitAnewArray(this->func->m_alloc, Func *, startCallNumber);
#ifdef _M_IX86
        bailOutInfo->inlinedStartCall = BVFixed::New(startCallNumber, this->func->m_alloc, false);
#endif
        uint totalOutParamCount = block->globOptData.totalOutParamCount;
        bailOutInfo->totalOutParamCount = totalOutParamCount;
        bailOutInfo->argOutSyms = JitAnewArrayZ(this->func->m_alloc, StackSym *, totalOutParamCount);

        FOREACH_SLISTBASE_ENTRY(IR::Opnd *, opnd, block->globOptData.callSequence)
        {
            if(opnd->GetStackSym()->HasArgSlotNum())
            {
                StackSym * sym;
                if(opnd->IsSymOpnd())
                {
                    sym = opnd->AsSymOpnd()->m_sym->AsStackSym();
                    Assert(sym->IsArgSlotSym());
                    Assert(sym->m_isSingleDef);
                    Assert(sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A
                        || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Inline
                        || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn
                        || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_SpreadArg
                        || sym->m_instrDef->m_opcode == Js::OpCode::ArgOut_A_Dynamic);
                }
                else
                {
                    sym = opnd->GetStackSym();
                    Assert(this->currentBlock->globOptData.FindValue(sym));
                    // StackSym args need to be re-captured
                    if (!argsToCapture)
                    {
                        argsToCapture = JitAnew(this->tempAlloc, BVSparse<JitArenaAllocator>, this->tempAlloc);
                    }

                    argsToCapture->Set(sym->m_id);
                }

                Assert(totalOutParamCount != 0);
                Assert(totalOutParamCount > currentArgOutCount);
                currentArgOutCount++;
#pragma prefast(suppress:26000, "currentArgOutCount is never 0");
                bailOutInfo->argOutSyms[totalOutParamCount - currentArgOutCount] = sym;
                // Note that there could be ArgOuts below current bailout instr that belong to current call (currentArgOutCount < argOutCount),
                // in which case we will have nulls in argOutSyms[] in start of section for current call, because we fill from tail.
                // Example: StartCall 3, ArgOut1,.. ArgOut2, Bailout,.. Argout3 -> [NULL, ArgOut1, ArgOut2].
            }
            else
            {
                Assert(opnd->IsRegOpnd());
                StackSym * sym = opnd->AsRegOpnd()->m_sym;
                Assert(!sym->IsArgSlotSym());
                Assert(sym->m_isSingleDef);
                Assert(sym->m_instrDef->m_opcode == Js::OpCode::StartCall);

                Assert(startCallNumber != 0);
                startCallNumber--;

                bailOutInfo->startCallFunc[startCallNumber] = sym->m_instrDef->m_func;
#ifdef _M_IX86
                if (sym->m_isInlinedArgSlot)
                {
                    bailOutInfo->inlinedStartCall->Set(startCallNumber);
                }
#endif
                uint argOutCount = sym->m_instrDef->GetArgOutCount(/*getInterpreterArgOutCount*/ true);
                Assert(totalOutParamCount >= argOutCount);
                Assert(argOutCount >= currentArgOutCount);

                bailOutInfo->RecordStartCallInfo(startCallNumber, sym->m_instrDef);
                totalOutParamCount -= argOutCount;
                currentArgOutCount = 0;
            }
        }
        NEXT_SLISTBASE_ENTRY;

        Assert(totalOutParamCount == 0);
        Assert(startCallNumber == 0);
        Assert(currentArgOutCount == 0);
    }

    // Save the constant values that we know so we can restore them directly.
    // This allows us to dead store the constant value assign.
    this->CaptureValues(block, bailOutInfo, argsToCapture);
}